

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

axbStatus_t check_equal_csr(axbMat_s *A,axbMat_s *B,char *test_desc)

{
  axbStatus_t aVar1;
  void *row_markers;
  void *col_indices;
  void *values;
  void *row_markers_00;
  void *col_indices_00;
  void *values_00;
  size_t sVar2;
  char *__format;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 uStackY_80;
  size_t A_nnz;
  size_t A_rows;
  size_t B_nnz;
  size_t B_rows;
  size_t B_cols;
  size_t A_cols;
  
  aVar1 = axbMatGetSizes(A,&A_rows,&A_cols);
  if (aVar1 == 0) {
    aVar1 = axbMatGetNonzerosSize(A,&A_nnz);
    if (aVar1 == 0) {
      aVar1 = axbMatGetSizes(B,&B_rows,&B_cols);
      if (aVar1 == 0) {
        aVar1 = axbMatGetNonzerosSize(B,&B_nnz);
        if (aVar1 == 0) {
          row_markers = malloc(A_rows * 4 + 4);
          sVar2 = A_nnz;
          col_indices = malloc(A_nnz * 4);
          values = malloc(sVar2 << 3);
          aVar1 = axbMatGetValuesCSR(A,row_markers,AXB_INT_32,col_indices,AXB_INT_32,values,
                                     AXB_REAL_DOUBLE);
          if (aVar1 == 0) {
            row_markers_00 = malloc(B_rows * 4 + 4);
            col_indices_00 = malloc(B_nnz * 4);
            values_00 = malloc(B_nnz << 3);
            aVar1 = axbMatGetValuesCSR(B,row_markers_00,AXB_INT_32,col_indices_00,AXB_INT_32,
                                       values_00,AXB_REAL_DOUBLE);
            if (aVar1 == 0) {
              sVar2 = 0;
              do {
                if (A_rows == sVar2) {
                  sVar2 = 0;
                  goto LAB_001035f8;
                }
                dVar4 = (double)*(int *)((long)row_markers + sVar2 * 4);
                dVar6 = (double)*(int *)((long)row_markers_00 + sVar2 * 4);
                dVar3 = dVar4 - dVar6;
                dVar5 = 1.0;
                if (dVar3 != 0.0) {
                  dVar5 = ABS(dVar4);
                  dVar6 = ABS(dVar6);
                  if (dVar5 <= dVar6) {
                    dVar5 = dVar6;
                  }
                }
                sVar2 = sVar2 + 1;
              } while (dVar3 / dVar5 <= 1e-13);
              __format = 
              "ERROR: Test %s (row array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n"
              ;
LAB_001037e3:
              fprintf(_stderr,__format,test_desc);
              goto LAB_001037ef;
            }
            uStackY_80 = 0x50;
          }
          else {
            uStackY_80 = 0x4a;
          }
        }
        else {
          uStackY_80 = 0x42;
        }
      }
      else {
        uStackY_80 = 0x41;
      }
    }
    else {
      uStackY_80 = 0x3e;
    }
  }
  else {
    uStackY_80 = 0x3d;
  }
  fprintf(_stderr,"Failure in line %d in file %s\n",uStackY_80,
          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
         );
  return aVar1;
  while( true ) {
    dVar5 = *(double *)((long)values + sVar2 * 8);
    dVar3 = *(double *)((long)values_00 + sVar2 * 8);
    dVar4 = dVar5 - dVar3;
    if (dVar4 != 0.0) {
      dVar5 = ABS(dVar5);
      dVar3 = ABS(dVar3);
      if (dVar5 <= dVar3) {
        dVar5 = dVar3;
      }
      dVar4 = dVar4 / dVar5;
    }
    sVar2 = sVar2 + 1;
    if (1e-13 < dVar4) break;
LAB_001035f8:
    if (A_nnz == sVar2) {
      printf("PASSED: Test %s\n",test_desc);
      free(row_markers);
      free(col_indices);
      free(values);
      free(row_markers_00);
      free(col_indices_00);
      free(values_00);
      return 0;
    }
    dVar4 = (double)*(int *)((long)col_indices + sVar2 * 4);
    dVar6 = (double)*(int *)((long)col_indices_00 + sVar2 * 4);
    dVar3 = dVar4 - dVar6;
    dVar5 = 1.0;
    if (dVar3 != 0.0) {
      dVar5 = ABS(dVar4);
      dVar6 = ABS(dVar6);
      if (dVar5 <= dVar6) {
        dVar5 = dVar6;
      }
    }
    if (1e-13 < dVar3 / dVar5) {
      __format = 
      "ERROR: Test %s (col array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n"
      ;
      goto LAB_001037e3;
    }
  }
  fprintf(_stderr,
          "ERROR: Test %s (col array) failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n"
          ,test_desc);
LAB_001037ef:
  exit(1);
}

Assistant:

axbStatus_t check_equal_csr(const struct axbMat_s *A, const struct axbMat_s *B, const char *test_desc)
{
  //
  // Check 1: Dimensions
  //
  size_t A_rows, A_cols, A_nnz;
  AXB_ERR_CHECK(axbMatGetSizes(A, &A_rows, &A_cols));
  AXB_ERR_CHECK(axbMatGetNonzerosSize(A, &A_nnz));

  size_t B_rows, B_cols, B_nnz;
  AXB_ERR_CHECK(axbMatGetSizes(B, &B_rows, &B_cols));
  AXB_ERR_CHECK(axbMatGetNonzerosSize(B, &B_nnz));

  //
  // Check 2: Values
  //
  int *A_row_markers = malloc(sizeof(int)*(A_rows+1));
  int *A_col_indices = malloc(sizeof(int)*A_nnz);
  double *A_values   = malloc(sizeof(double)*A_nnz);
  AXB_ERR_CHECK(axbMatGetValuesCSR(A, A_row_markers, AXB_INT_32, A_col_indices, AXB_INT_32, A_values, AXB_REAL_DOUBLE));


  int *B_row_markers = malloc(sizeof(int)*(B_rows+1));
  int *B_col_indices = malloc(sizeof(int)*B_nnz);
  double *B_values   = malloc(sizeof(double)*B_nnz);
  AXB_ERR_CHECK(axbMatGetValuesCSR(B, B_row_markers, AXB_INT_32, B_col_indices, AXB_INT_32, B_values, AXB_REAL_DOUBLE));


  // test row array:
  for (size_t i=0; i<A_rows; ++i) {
    double rel_diff = get_rel_diff(A_row_markers[i], B_row_markers[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (row array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n", test_desc, rel_diff, A_row_markers[i], B_row_markers[i]);
      exit(EXIT_FAILURE);
    }
  }

  // test col indices and values arrays:
  for (size_t i=0; i<A_nnz; ++i) {
    double rel_diff = get_rel_diff(A_col_indices[i], B_col_indices[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (col array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n", test_desc, rel_diff, A_col_indices[i], B_col_indices[i]);
      exit(EXIT_FAILURE);
    }

    rel_diff = get_rel_diff(A_values[i], B_values[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (col array) failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n", test_desc, rel_diff, A_values[i], B_values[i]);
      exit(EXIT_FAILURE);
    }

  }


  printf("PASSED: Test %s\n", test_desc);

  free(A_row_markers);
  free(A_col_indices);
  free(A_values);
  free(B_row_markers);
  free(B_col_indices);
  free(B_values);
  return 0;
}